

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O1

void __thiscall glcts::TextureBufferAtomicFunctions::deinit(TextureBufferAtomicFunctions *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar2 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_cs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_cs_id = 0;
  }
  if (this->m_tbo_tex_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_tbo_tex_id);
    this->m_tbo_tex_id = 0;
  }
  if (this->m_tbo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_tbo_id);
    this->m_tbo_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferAtomicFunctions::deinit(void)
{
	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);

	/* Delete GLES objects */
	if (0 != m_po_id)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (0 != m_cs_id)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}

	if (0 != m_tbo_tex_id)
	{
		gl.deleteTextures(1, &m_tbo_tex_id);
		m_tbo_tex_id = 0;
	}

	if (0 != m_tbo_id)
	{
		gl.deleteBuffers(1, &m_tbo_id);
		m_tbo_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}